

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void * MemOSRealloc(void *pOld,sxu32 nBytes)

{
  sxu32 *psVar1;
  
  if (*(uint *)((long)pOld + -4) < nBytes) {
    psVar1 = (sxu32 *)realloc((void *)((long)pOld + -4),(ulong)(nBytes + 4));
    if (psVar1 == (sxu32 *)0x0) {
      pOld = (sxu32 *)0x0;
    }
    else {
      *psVar1 = nBytes;
      pOld = psVar1 + 1;
    }
  }
  return pOld;
}

Assistant:

static void * MemOSRealloc(void *pOld, sxu32 nBytes)
{
	sxu32 *pOldChunk;
	sxu32 *pChunk;
	pOldChunk = (sxu32 *)(((char *)pOld)-sizeof(sxu32));
	if( pOldChunk[0] >= nBytes ){
		return pOld;
	}
	pChunk = (sxu32 *)SyOSHeapRealloc(pOldChunk, nBytes + sizeof(sxu32));
	if( pChunk == 0 ){
		return 0;
	}
	pChunk[0] = nBytes;
	return (void *)&pChunk[1];
}